

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_loads_statics.cpp
# Opt level: O2

MyLoadCustomMultiple * __thiscall test_1::MyLoadCustomMultiple::Clone(MyLoadCustomMultiple *this)

{
  ChLoadCustomMultiple *this_00;
  
  this_00 = (ChLoadCustomMultiple *)operator_new(0x68);
  chrono::ChLoadCustomMultiple::ChLoadCustomMultiple(this_00,&this->super_ChLoadCustomMultiple);
  *(undefined ***)this_00 = &PTR__ChLoadCustomMultiple_00146570;
  return (MyLoadCustomMultiple *)this_00;
}

Assistant:

virtual MyLoadCustomMultiple* Clone() const override { return new MyLoadCustomMultiple(*this); }